

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

int ma_strncat_s(char *dst,size_t dstSizeInBytes,char *src,size_t count)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  
  if (dst != (char *)0x0) {
    if (dstSizeInBytes == 0) {
      return 0x22;
    }
    pcVar4 = dst;
    if (src != (char *)0x0) {
      do {
        if (*pcVar4 == '\0') {
          sVar2 = dstSizeInBytes - 1;
          if (count != 0xffffffffffffffff) {
            sVar2 = count;
          }
          sVar3 = 0;
          goto LAB_001347ac;
        }
        dstSizeInBytes = dstSizeInBytes - 1;
        pcVar4 = pcVar4 + 1;
      } while (dstSizeInBytes != 0);
    }
  }
  return 0x16;
LAB_001347ac:
  if ((src[sVar3] == '\0') || (sVar2 == sVar3)) {
    dst = pcVar4 + sVar3;
    iVar1 = 0;
    goto LAB_001347d5;
  }
  pcVar4[sVar3] = src[sVar3];
  sVar3 = sVar3 + 1;
  if (dstSizeInBytes == sVar3) {
    iVar1 = 0x22;
LAB_001347d5:
    *dst = '\0';
    return iVar1;
  }
  goto LAB_001347ac;
}

Assistant:

MA_API MA_NO_INLINE int ma_strncat_s(char* dst, size_t dstSizeInBytes, const char* src, size_t count)
{
    char* dstorig;

    if (dst == 0) {
        return 22;
    }
    if (dstSizeInBytes == 0) {
        return 34;
    }
    if (src == 0) {
        return 22;
    }

    dstorig = dst;

    while (dstSizeInBytes > 0 && dst[0] != '\0') {
        dst += 1;
        dstSizeInBytes -= 1;
    }

    if (dstSizeInBytes == 0) {
        return 22;  /* Unterminated. */
    }


    if (count == ((size_t)-1)) {        /* _TRUNCATE */
        count = dstSizeInBytes - 1;
    }

    while (dstSizeInBytes > 0 && src[0] != '\0' && count > 0) {
        *dst++ = *src++;
        dstSizeInBytes -= 1;
        count -= 1;
    }

    if (dstSizeInBytes > 0) {
        dst[0] = '\0';
    } else {
        dstorig[0] = '\0';
        return 34;
    }

    return 0;
}